

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_harmonic_symplectic.c
# Opt level: O1

int main(int argc,char **argv)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  FILE *pFVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  double *pdVar12;
  double *pdVar13;
  char *pcVar14;
  undefined8 in_R8;
  undefined8 in_R9;
  longdouble lVar15;
  longdouble lVar16;
  longdouble lVar17;
  undefined4 uVar18;
  undefined4 uVar20;
  double dVar19;
  double dVar21;
  double dVar22;
  void *arkode_mem;
  SUNContext sunctx;
  sunrealtype tret;
  longdouble lVar23;
  int local_e0;
  int local_d0;
  undefined8 local_c8;
  int local_bc;
  double local_b8;
  int local_ac;
  double local_a8;
  undefined2 uStack_a0;
  undefined6 uStack_9e;
  undefined8 local_98;
  double local_90;
  double local_88;
  double dStack_80;
  double local_78;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  longdouble local_3c;
  
  local_98 = 0;
  local_c8 = 0;
  bVar3 = true;
  if (argc < 2) {
    local_a8 = 0.0;
    local_e0 = 4;
    local_d0 = 8;
    local_b8 = 6.283185307179586;
    uVar18 = 0xd2f1a9fc;
    uVar20 = 0x3f50624d;
    local_bc = 1;
  }
  else {
    local_e0 = 4;
    local_d0 = 8;
    local_a8 = 0.0;
    local_bc = 1;
    local_b8 = 6.283185307179586;
    uVar18 = 0xd2f1a9fc;
    uVar20 = 0x3f50624d;
    iVar8 = 1;
    do {
      pcVar14 = argv[iVar8];
      iVar6 = strcmp(pcVar14,"--order");
      if (iVar6 == 0) {
        iVar6 = iVar8 + 1;
        local_e0 = atoi(argv[(long)iVar8 + 1]);
      }
      else {
        iVar6 = strcmp(pcVar14,"--tf");
        if (iVar6 == 0) {
          iVar6 = iVar8 + 1;
          local_b8 = strtod(argv[(long)iVar8 + 1],(char **)0x0);
        }
        else {
          iVar6 = strcmp(pcVar14,"--dt");
          if (iVar6 == 0) {
            dVar1 = strtod(argv[(long)iVar8 + 1],(char **)0x0);
            uVar18 = SUB84(dVar1,0);
            uVar20 = (undefined4)((ulong)dVar1 >> 0x20);
            iVar6 = iVar8 + 1;
          }
          else {
            iVar6 = strcmp(pcVar14,"--nout");
            if (iVar6 == 0) {
              iVar6 = iVar8 + 1;
              local_d0 = atoi(argv[(long)iVar8 + 1]);
            }
            else {
              iVar7 = strcmp(pcVar14,"--use-compensated-sums");
              iVar6 = iVar8;
              if (iVar7 == 0) {
                local_a8 = 4.94065645841247e-324;
              }
              else {
                iVar8 = strcmp(pcVar14,"--disable-tstop");
                if (iVar8 != 0) {
                  iVar8 = strcmp(pcVar14,"--help");
                  if (iVar8 != 0) {
                    fprintf(_stderr,"ERROR: unrecognized argument %s\n",pcVar14);
                  }
                  PrintHelp();
                  bVar3 = false;
                  goto LAB_001015a9;
                }
                local_bc = 0;
              }
            }
          }
        }
      }
      iVar8 = iVar6 + 1;
    } while (iVar8 < argc);
    bVar3 = true;
  }
LAB_001015a9:
  if (bVar3) {
    dVar1 = (double)CONCAT44(uVar20,uVar18);
    uVar9 = SUNContext_Create(0,&local_98);
    if ((int)uVar9 < 0) {
      pcVar14 = "SUNContext_Create";
    }
    else {
      puts("\n   Begin simple harmonic oscillator problem\n");
      local_88 = 10.0;
      dStack_80 = 0.0;
      local_78 = 1.0;
      uVar10 = N_VNew_Serial(2,local_98);
      uVar11 = N_VClone(uVar10);
      pdVar12 = (double *)N_VGetArrayPointer(uVar10);
      *pdVar12 = 10.0;
      pdVar12[1] = -0.0;
      local_c8 = SPRKStepCreate(0,xdot,vdot,uVar10,local_98);
      uVar9 = ARKodeSetOrder(local_c8,local_e0);
      if ((int)uVar9 < 0) {
        pcVar14 = "ARKodeSetOrder";
      }
      else {
        uVar9 = ARKodeSetUserData(local_c8,&local_88);
        if ((int)uVar9 < 0) {
          pcVar14 = "ARKodeSetUserData";
        }
        else {
          uVar9 = SPRKStepSetUseCompensatedSums(local_c8,local_a8);
          if ((int)uVar9 < 0) {
            pcVar14 = "SPRKStepSetUseCompensatedSums";
          }
          else {
            uVar9 = ARKodeSetFixedStep(uVar18,local_c8);
            uVar5 = local_c8;
            if (-1 < (int)uVar9) {
              dVar21 = ceil(local_b8 / dVar1);
              uVar9 = ARKodeSetMaxNumSteps(uVar5,(long)dVar21 + 2);
              pFVar4 = _stdout;
              if ((int)uVar9 < 0) {
                fprintf(_stderr,"\nERROR: %s() failed with retval = %d\n\n","ARKodeSetMaxNumSteps",
                        (ulong)uVar9);
                return 1;
              }
              local_90 = 0.0;
              lVar15 = (longdouble)*pdVar12;
              pdVar13 = (double *)N_VGetArrayPointer(uVar10);
              local_48 = (pdVar13[1] * pdVar13[1] + local_78 * local_78 * *pdVar13 * *pdVar13) * 0.5
              ;
              lVar16 = (longdouble)local_48;
              lVar23 = (longdouble)0;
              lVar17 = lVar23;
              fprintf(pFVar4,"t = %.6Lf, x(t) = %.6Lf, E = %.6Lf, sol. err = %.6Lf\n");
              if (0 < local_d0) {
                local_60 = local_b8 / (double)local_d0;
                dVar21 = local_60 + 0.0;
                local_68 = (double)(local_e0 + -2);
                local_ac = 0;
                do {
                  if (local_bc != 0) {
                    ARKodeSetStopTime(SUB84(dVar21,0),local_c8);
                  }
                  iVar8 = ARKodeEvolve(SUB84(dVar21,0),local_c8,uVar10,&local_90,1,in_R8,in_R9,
                                       lVar23,lVar15,lVar16,lVar17);
                  dVar22 = local_90;
                  pdVar13 = (double *)N_VGetArrayPointer(uVar11);
                  local_a8 = local_88;
                  dVar19 = cos(local_78 * dVar22 + dStack_80);
                  *pdVar13 = dVar19 * local_a8;
                  local_a8 = -local_88 * local_78;
                  uStack_a0 = 0;
                  uStack_9e = 0x800000000000;
                  dVar19 = sin(local_78 * dVar22 + dStack_80);
                  pdVar13[1] = dVar19 * local_a8;
                  N_VLinearSum(0,0xbff0000000000000,uVar10,uVar11,uVar11);
                  dVar19 = (double)N_VDotProd(uVar11,uVar11);
                  if (dVar19 < 0.0) {
                    dVar19 = sqrt(dVar19);
                  }
                  else {
                    dVar19 = SQRT(dVar19);
                  }
                  pFVar4 = _stdout;
                  local_a8 = SUB108((longdouble)local_90,0);
                  uStack_a0 = (undefined2)((unkuint10)(longdouble)local_90 >> 0x40);
                  local_3c = (longdouble)*pdVar12;
                  pdVar13 = (double *)N_VGetArrayPointer(uVar10);
                  local_58 = (pdVar13[1] * pdVar13[1] + local_78 * local_78 * *pdVar13 * *pdVar13) *
                             0.5;
                  lVar16 = (longdouble)local_58;
                  lVar17 = (longdouble)dVar19;
                  lVar23 = (longdouble)CONCAT28(uStack_a0,local_a8);
                  lVar15 = local_3c;
                  local_50 = dVar19;
                  fprintf(pFVar4,"t = %.6Lf, x(t) = %.6Lf, E = %.6Lf, sol. err = %.16Le\n");
                  dVar2 = pow(10.0,local_68);
                  dVar22 = 2.220446049250313e-13;
                  if (2.220446049250313e-13 < dVar1 / dVar2) {
                    dVar22 = pow(10.0,local_68);
                    dVar22 = dVar1 / dVar22;
                  }
                  if (dVar22 < dVar19) {
                    main_cold_2();
                    iVar8 = 1;
                    local_ac = 1;
                  }
                  else if (iVar8 < 0) {
                    main_cold_1();
                    iVar8 = 2;
                  }
                  else {
                    dVar19 = dVar21 + local_60;
                    dVar21 = local_b8;
                    if (dVar19 <= local_b8) {
                      dVar21 = dVar19;
                    }
                    iVar8 = 0;
                  }
                  if (iVar8 != 0) {
                    if (iVar8 != 2) {
                      return local_ac;
                    }
                    break;
                  }
                  local_d0 = local_d0 + -1;
                } while (local_d0 != 0);
              }
              fputc(10,_stdout);
              N_VDestroy(uVar10);
              N_VDestroy(uVar11);
              ARKodePrintAllStats(local_c8,_stdout,0);
              ARKodeFree(&local_c8);
              SUNContext_Free(&local_98);
              return 0;
            }
            pcVar14 = "ARKodeSetFixedStep";
          }
        }
      }
    }
    fprintf(_stderr,"\nERROR: %s() failed with retval = %d\n\n",pcVar14,(ulong)uVar9);
  }
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  ProgramArgs args;
  UserData udata;
  SUNContext sunctx       = NULL;
  N_Vector y              = NULL;
  N_Vector solution       = NULL;
  sunrealtype* ydata      = NULL;
  void* arkode_mem        = NULL;
  int iout                = 0;
  int retval              = 0;
  int order               = 0;
  int use_compsums        = 0;
  int num_output_times    = 0;
  sunrealtype Tf          = SUN_RCONST(0.0);
  sunrealtype dt          = SUN_RCONST(0.0);
  sunrealtype dTout       = SUN_RCONST(0.0);
  const sunrealtype T0    = SUN_RCONST(0.0);
  const sunrealtype A     = SUN_RCONST(10.0);
  const sunrealtype phi   = SUN_RCONST(0.0);
  const sunrealtype omega = SUN_RCONST(1.0);

  /* Parse the command line arguments */
  if (ParseArgs(argc, argv, &args)) { return 1; };

  /* Default integrator options and problem parameters */
  order            = args.order;
  use_compsums     = args.use_compsums;
  num_output_times = args.num_output_times;
  Tf               = args.Tf;
  dt               = args.dt;
  dTout            = (Tf - T0) / ((sunrealtype)num_output_times);

  /* Default problem parameters */

  /* Create the SUNDIALS context object for this simulation */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  printf("\n   Begin simple harmonic oscillator problem\n\n");

  /* Allocate and fill udata structure */
  udata.A     = A;
  udata.phi   = phi;
  udata.omega = omega;

  /* Allocate our state vector [x, v]^T */
  y        = N_VNew_Serial(2, sunctx);
  solution = N_VClone(y);

  /* Fill the initial conditions (x0 then v0) */
  ydata    = N_VGetArrayPointer(y);
  ydata[0] = A * cos(phi);
  ydata[1] = -A * omega * sin(phi);

  /* Create SPRKStep integrator */
  arkode_mem = SPRKStepCreate(xdot, vdot, T0, y, sunctx);

  retval = ARKodeSetOrder(arkode_mem, order);
  if (check_retval(&retval, "ARKodeSetOrder", 1)) { return 1; }

  retval = ARKodeSetUserData(arkode_mem, &udata);
  if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }

  retval = SPRKStepSetUseCompensatedSums(arkode_mem, use_compsums);
  if (check_retval(&retval, "SPRKStepSetUseCompensatedSums", 1)) { return 1; }

  retval = ARKodeSetFixedStep(arkode_mem, dt);
  if (check_retval(&retval, "ARKodeSetFixedStep", 1)) { return 1; }

  retval = ARKodeSetMaxNumSteps(arkode_mem, ((long int)ceil(Tf / dt)) + 2);
  if (check_retval(&retval, "ARKodeSetMaxNumSteps", 1)) { return 1; }

  /* Print out starting energy, momentum before integrating */
  sunrealtype tret = T0;
  sunrealtype tout = T0 + dTout;
  fprintf(stdout, "t = %.6Lf, x(t) = %.6Lf, E = %.6Lf, sol. err = %.6Lf\n",
          (long double)tret, (long double)ydata[0],
          (long double)Energy(y, dt, &udata), (long double)SUN_RCONST(0.0));

  /* Do integration */
  for (iout = 0; iout < num_output_times; iout++)
  {
    if (args.use_tstop) { ARKodeSetStopTime(arkode_mem, tout); }
    retval = ARKodeEvolve(arkode_mem, tout, y, &tret, ARK_NORMAL);

    /* Compute the analytical solution */
    Solution(tret, y, solution, &udata);

    /* Compute L2 error */
    N_VLinearSum(SUN_RCONST(1.0), y, -SUN_RCONST(1.0), solution, solution);
    sunrealtype err = sqrt(N_VDotProd(solution, solution));

    /* Output current integration status */
    fprintf(stdout, "t = %.6Lf, x(t) = %.6Lf, E = %.6Lf, sol. err = %.16Le\n",
            (long double)tret, (long double)ydata[0],
            (long double)Energy(y, dt, &udata), (long double)err);

    /* Check that solution error is within tolerance */
    if (err > SUNMAX(dt / pow(10, order - 2), 1000 * SUN_UNIT_ROUNDOFF))
    {
      fprintf(stderr, "FAILURE: solution error is too high\n");
      return 1;
    }

    /* Check if the solve was successful, if so, update the time and continue */
    if (retval >= 0)
    {
      tout += dTout;
      tout = (tout > Tf) ? Tf : tout;
    }
    else
    {
      fprintf(stderr, "Solver failure, stopping integration\n");
      break;
    }
  }

  fprintf(stdout, "\n");
  N_VDestroy(y);
  N_VDestroy(solution);
  ARKodePrintAllStats(arkode_mem, stdout, SUN_OUTPUTFORMAT_TABLE);
  ARKodeFree(&arkode_mem);
  SUNContext_Free(&sunctx);

  return 0;
}